

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::MustBeInDebugMode(FunctionBody *this)

{
  Utf8SourceInfo *pUVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  void *pvVar5;
  
  pUVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if ((((pUVar1->debugModeSource).ptr == (uchar *)0x0) && ((pUVar1->field_0xa8 & 0x20) == 0)) ||
     ((pUVar1->field_0xa8 & 0x40) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f4,"(GetUtf8SourceInfo()->IsInDebugMode())",
                                "GetUtf8SourceInfo()->IsInDebugMode()");
    if (!bVar3) goto LAB_00775117;
    *puVar4 = 0;
  }
  if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f5,"(m_sourceInfo.pSpanSequence == nullptr)",
                                "m_sourceInfo.pSpanSequence == nullptr");
    if (!bVar3) goto LAB_00775117;
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if (pvVar5 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f6,"(this->GetStatementMaps() != nullptr)",
                                "this->GetStatementMaps() != nullptr");
    if (!bVar3) {
LAB_00775117:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void FunctionBody::MustBeInDebugMode()
    {
        Assert(GetUtf8SourceInfo()->IsInDebugMode());
        Assert(m_sourceInfo.pSpanSequence == nullptr);
        Assert(this->GetStatementMaps() != nullptr);
    }